

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O2

void board_moveLinkMake(Board *board,MoveLink *lastLink)

{
  code *pcVar1;
  long lVar2;
  Move *moveLinks [2048];
  undefined8 auStack_4020 [2050];
  
  lVar2 = 0;
  while( true ) {
    if (lastLink == (MoveLink *)0x0) {
      for (; 0 < lVar2; lVar2 = lVar2 + -1) {
        auStack_4020[0] = 0x10609c;
        board_moveMake(board,(Move *)auStack_4020[lVar2]);
      }
      return;
    }
    if (SCARRY8(lVar2,1)) break;
    auStack_4020[lVar2 + 1] = lastLink->move;
    lastLink = lastLink->prev;
    lVar2 = lVar2 + 1;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void board_moveLinkMake(Board * board, MoveLink * lastLink)
{
	Move * moveLinks[2048];
	long i=0;

	while(lastLink)
	{
		moveLinks[i++] = lastLink->move;
		lastLink = lastLink->prev;
	}

	for(--i;i>=0;i--)
	{
		board_moveMake(board, moveLinks[i]);
	}
}